

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O0

void pem_aes_decrypt(uchar *aes_iv,uint keylen,uchar *buf,size_t buflen,uchar *pwd,size_t pwdlen)

{
  uchar local_178 [8];
  uchar aes_key [32];
  mbedtls_aes_context aes_ctx;
  size_t pwdlen_local;
  uchar *pwd_local;
  size_t buflen_local;
  uchar *buf_local;
  uint keylen_local;
  uchar *aes_iv_local;
  
  mbedtls_aes_init((mbedtls_aes_context *)(aes_key + 0x18));
  pem_pbkdf1(local_178,(ulong)keylen,aes_iv,pwd,pwdlen);
  mbedtls_aes_setkey_dec((mbedtls_aes_context *)(aes_key + 0x18),local_178,keylen << 3);
  mbedtls_aes_crypt_cbc((mbedtls_aes_context *)(aes_key + 0x18),0,buflen,aes_iv,buf,buf);
  mbedtls_aes_free((mbedtls_aes_context *)(aes_key + 0x18));
  mbedtls_zeroize(local_178,(ulong)keylen);
  return;
}

Assistant:

static void pem_aes_decrypt( unsigned char aes_iv[16], unsigned int keylen,
                               unsigned char *buf, size_t buflen,
                               const unsigned char *pwd, size_t pwdlen )
{
    mbedtls_aes_context aes_ctx;
    unsigned char aes_key[32];

    mbedtls_aes_init( &aes_ctx );

    pem_pbkdf1( aes_key, keylen, aes_iv, pwd, pwdlen );

    mbedtls_aes_setkey_dec( &aes_ctx, aes_key, keylen * 8 );
    mbedtls_aes_crypt_cbc( &aes_ctx, MBEDTLS_AES_DECRYPT, buflen,
                     aes_iv, buf, buf );

    mbedtls_aes_free( &aes_ctx );
    mbedtls_zeroize( aes_key, keylen );
}